

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O3

int fprintHTML(FILE *f,SXML_CHAR *str)

{
  long lVar1;
  char cVar2;
  long lVar3;
  _html_special_dict *p_Var4;
  int iVar5;
  
  cVar2 = *str;
  if (cVar2 == '\0') {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      p_Var4 = HTML_SPECIAL_DICT;
      if (cVar2 != '<') {
        lVar1 = 0;
        do {
          lVar3 = lVar1;
          if (lVar3 + 0x18 == 0x78) {
            if (f != (FILE *)0x0) {
              fputc((int)cVar2,(FILE *)f);
            }
            iVar5 = iVar5 + 1;
            goto LAB_001063d0;
          }
          lVar1 = lVar3 + 0x18;
        } while (cVar2 != (&HTML_SPECIAL_DICT[1].chr)[lVar3]);
        p_Var4 = (_html_special_dict *)(lVar3 + 0x10ad38);
      }
      if (f != (FILE *)0x0) {
        fputs(p_Var4->html,(FILE *)f);
      }
      iVar5 = iVar5 + p_Var4->html_len;
LAB_001063d0:
      cVar2 = str[1];
      str = str + 1;
    } while (cVar2 != '\0');
  }
  return iVar5;
}

Assistant:

int fprintHTML(FILE* f, SXML_CHAR* str)
{
	SXML_CHAR* p;
	int i, n;
	
	for (p = str, n = 0; *p != NULC; p++) {
		for (i = 0; HTML_SPECIAL_DICT[i].chr; i++) {
			if (*p != HTML_SPECIAL_DICT[i].chr)
				continue;
			if (f != NULL)
				sx_fputs(HTML_SPECIAL_DICT[i].html, f);
			n += HTML_SPECIAL_DICT[i].html_len;
			break;
		}
		if (HTML_SPECIAL_DICT[i].chr == NULC) {
			if (f != NULL)
				(void)sx_fputc(*p, f);
			n++;
		}
	}
	
	return n;
}